

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Waving.h
# Opt level: O1

void __thiscall
WavingSketch<8U,_16U,_8U>::Bucket::Insert
          (Bucket *this,Data<8U> *item,uint32_t seed_s,uint32_t seed_incast,bool *is_empty)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  
  uVar3 = Data<8U>::Hash(item,seed_s);
  uVar4 = Data<8U>::Hash(item,seed_incast);
  uVar5 = uVar4 & 0xf;
  *is_empty = false;
  uVar6 = 0xffffffff;
  iVar8 = 0x7fffffff;
  lVar9 = 0;
  uVar7 = 0;
  while( true ) {
    iVar1 = this->counters[uVar7];
    if (iVar1 == 0) {
      *(undefined8 *)this->items[uVar7].str = *(undefined8 *)item->str;
      this->counters[uVar7] = -1;
      *is_empty = true;
      return;
    }
    if (*(long *)(this->items[0].str + lVar9) == *(long *)item->str) break;
    iVar10 = -iVar1;
    if (0 < iVar1) {
      iVar10 = iVar1;
    }
    if (iVar10 < iVar8) {
      uVar6 = uVar7 & 0xffffffff;
      iVar8 = iVar10;
    }
    uVar7 = uVar7 + 1;
    lVar9 = lVar9 + 8;
    if (uVar7 == 8) {
      iVar1 = COUNT[uVar3 & 1];
      if (iVar8 <= this->incast[uVar5] * iVar1) {
        if (this->counters[uVar6] < 0) {
          uVar3 = Data<8U>::Hash(this->items + uVar6,seed_s);
          iVar10 = this->counters[uVar6];
          iVar2 = COUNT[uVar3 & 1];
          uVar3 = Data<8U>::Hash(this->items + uVar6,seed_incast);
          this->incast[uVar3 & 0xf] = this->incast[uVar3 & 0xf] - (short)iVar10 * (short)iVar2;
        }
        *(undefined8 *)this->items[uVar6].str = *(undefined8 *)item->str;
        this->counters[uVar6] = iVar8 + 1;
      }
      this->incast[uVar5] = this->incast[uVar5] + (short)iVar1;
      return;
    }
  }
  if (-1 < iVar1) {
    this->counters[uVar7] = iVar1 + 1;
    this->incast[uVar5] = this->incast[uVar5] + (short)COUNT[uVar3 & 1];
    return;
  }
  this->counters[uVar7] = iVar1 + -1;
  return;
}

Assistant:

void Insert(const Data<DATA_LEN>& item, uint32_t seed_s, uint32_t seed_incast, bool& is_empty) {
			uint32_t choice = item.Hash(seed_s) & 1;
			uint32_t whichcast = item.Hash(seed_incast) % counter_num;
			count_type min_num = INT_MAX;
			uint32_t min_pos = -1;
			is_empty = false;
			for (uint32_t i = 0; i < slot_num; ++i) {
				if (counters[i] == 0) {
					// The error free item's counter is negative, which is a trick to
					// be differentiated from items which are not error free.
					items[i] = item;
					counters[i] = -1;
					is_empty = true;
					return;
				}
				else if (items[i] == item) {
					if (counters[i] < 0)
						counters[i]--;
					else {
						counters[i]++;
						incast[whichcast] += COUNT[choice];
					}
					return;
				}

				count_type counter_val = std::abs(counters[i]);
				if (counter_val < min_num) {
					min_num = counter_val;
					min_pos = i;
				}
			}

			if (incast[whichcast] * COUNT[choice] >= int(min_num * factor)) {
				if (counters[min_pos] < 0) {
					uint32_t min_choice = items[min_pos].Hash(seed_s) & 1;
					incast[items[min_pos].Hash(seed_incast) % counter_num] -=
						COUNT[min_choice] * counters[min_pos];
				}
				items[min_pos] = item;
				counters[min_pos] = min_num + 1;
			}
			incast[whichcast] += COUNT[choice];
		}